

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_UInt32OptionValueOutOfRange_Test::
~ValidationErrorTest_UInt32OptionValueOutOfRange_Test
          (ValidationErrorTest_UInt32OptionValueOutOfRange_Test *this)

{
  ValidationErrorTest_UInt32OptionValueOutOfRange_Test *this_local;
  
  ~ValidationErrorTest_UInt32OptionValueOutOfRange_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, UInt32OptionValueOutOfRange) {
  BuildDescriptorMessagesInTestPool();

  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_UINT32 extendee: \"google.protobuf.FileOptions\" }"
      "options { uninterpreted_option { name { name_part: \"foo\" "
      "                                        is_extension: true } "
      "                                 positive_int_value: 0x100000000 } }",

      "foo.proto: foo.proto: OPTION_VALUE: Value out of range, 0 to "
      "4294967295, for uint32 option \"foo\".\n");
}